

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

char * output_format_str(output_formats format)

{
  undefined4 in_EDI;
  char *local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = "none";
    break;
  case 1:
    local_8 = "csv";
    break;
  case 2:
    local_8 = "json";
    break;
  case 3:
    local_8 = "jsonl";
    break;
  case 4:
    local_8 = "md";
    break;
  case 5:
    local_8 = "sql";
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llama-bench/llama-bench.cpp"
               ,0x74,"invalid output format");
  }
  return local_8;
}

Assistant:

static const char * output_format_str(output_formats format) {
    switch (format) {
        case NONE:
            return "none";
        case CSV:
            return "csv";
        case JSON:
            return "json";
        case JSONL:
            return "jsonl";
        case MARKDOWN:
            return "md";
        case SQL:
            return "sql";
        default:
            GGML_ABORT("invalid output format");
    }
}